

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O1

void __thiscall
TasGrid::GridWavelet::getDifferentiationWeights(GridWavelet *this,double *x,double *weights)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  size_type sVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  size_type __n;
  vector<double,_std::allocator<double>_> local_weights;
  allocator_type local_49;
  vector<double,_std::allocator<double>_> local_48;
  
  lVar8 = 0x18;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar8 = 0x40;
  }
  uVar1 = *(uint *)((long)&(this->super_BaseCanonicalGrid).acceleration + lVar8);
  __n = (size_type)(int)uVar1;
  if (0 < (long)__n) {
    sVar5 = 0;
    do {
      evalDiffBasis(this,(int *)(*(long *)((long)&(this->super_BaseCanonicalGrid).
                                                  _vptr_BaseCanonicalGrid + lVar8) * sVar5 * 4 +
                                *(long *)((long)&(this->super_BaseCanonicalGrid).num_dimensions +
                                         lVar8)),x,
                    weights + (long)(int)sVar5 *
                              (long)(this->super_BaseCanonicalGrid).num_dimensions);
      sVar5 = sVar5 + 1;
    } while (__n != sVar5);
  }
  if ((this->inter_matrix).num_rows != uVar1) {
    buildInterpolationMatrix(this);
  }
  ::std::vector<double,_std::allocator<double>_>::vector(&local_48,__n,&local_49);
  uVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  uVar7 = (ulong)uVar2;
  if (0 < (int)uVar2) {
    lVar8 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar6 = 0;
        pdVar4 = weights;
        do {
          local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] = *pdVar4;
          uVar6 = uVar6 + 1;
          pdVar4 = pdVar4 + (int)uVar7;
        } while (uVar1 != uVar6);
      }
      TasSparse::WaveletBasisMatrix::invertTransposed
                (&this->inter_matrix,(this->super_BaseCanonicalGrid).acceleration,
                 local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (0 < (int)uVar1) {
        iVar3 = (this->super_BaseCanonicalGrid).num_dimensions;
        uVar7 = 0;
        pdVar4 = weights;
        do {
          *pdVar4 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar7];
          uVar7 = uVar7 + 1;
          pdVar4 = pdVar4 + iVar3;
        } while (uVar1 != uVar7);
      }
      lVar8 = lVar8 + 1;
      uVar7 = (ulong)(this->super_BaseCanonicalGrid).num_dimensions;
      weights = weights + 1;
    } while (lVar8 < (long)uVar7);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridWavelet::getDifferentiationWeights(const double x[], double weights[]) const {
    const MultiIndexSet &work = (points.empty()) ? needed : points;
    int num_points = work.getNumIndexes();
    #pragma omp parallel for
    for (int i=0; i<num_points; i++) {
        evalDiffBasis(work.getIndex(i), x, &(weights[i * num_dimensions]));
    }
    if (inter_matrix.getNumRows() != num_points) buildInterpolationMatrix();
    // Solve the linear wavelet system for each direction/partial derivative and re-index.
    std::vector<double> local_weights(num_points);
    for (int d=0; d<num_dimensions; d++) {
        for (int i=0; i<num_points; i++)
            local_weights[i] = weights[i * num_dimensions + d];
        inter_matrix.invertTransposed(acceleration, local_weights.data());
        for (int i=0; i<num_points; i++)
            weights[i * num_dimensions + d] = local_weights[i];
    }
}